

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

void __thiscall IRT::CFrame::addAddress(CFrame *this,string *name,IAddress *address)

{
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_false,_true>,_bool>
  pVar1;
  unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_> local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_true>
  local_30;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_false,_true>,_bool>
  result;
  IAddress *address_local;
  string *name_local;
  CFrame *this_local;
  
  result._8_8_ = address;
  std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>::
  unique_ptr<std::default_delete<IRT::IAddress_const>,void>
            ((unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>> *)&local_38,
             address);
  pVar1 = std::
          unordered_map<std::__cxx11::string,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>>>>
          ::
          emplace<std::__cxx11::string_const&,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>>
                    ((unordered_map<std::__cxx11::string,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::IAddress_const,std::default_delete<IRT::IAddress_const>>>>>
                      *)&this->localVisibilityAddresses,name,&local_38);
  local_30._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_true>
       ._M_cur;
  result.first.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_true>
  ._M_cur._0_1_ = pVar1.second;
  std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>::~unique_ptr
            (&local_38);
  return;
}

Assistant:

void CFrame::addAddress(const std::string &name, const IAddress *address) {
    auto result = localVisibilityAddresses.emplace(name, std::unique_ptr<const IAddress>(address));
    // overwriting may happen in case there is a field and a local/argument with the same name
    // assert( result.second );
}